

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcs.c
# Opt level: O0

void mcswrt(mcscxdef *ctx,mcsdsdef *desc,uchar *buf,ushort bufl)

{
  int iVar1;
  size_t sVar2;
  ushort in_CX;
  void *in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  int tries;
  mcscxdef *in_stack_00000210;
  char *in_stack_ffffffffffffffd8;
  int iVar3;
  undefined2 in_stack_ffffffffffffffe4;
  
  *(ushort *)((long)in_RSI + 10) = in_CX;
  iVar3 = 0;
  while( true ) {
    if (1 < iVar3) {
      errsigf((errcxdef *)CONCAT26(in_CX,CONCAT24(in_stack_ffffffffffffffe4,iVar3)),
              in_stack_ffffffffffffffd8,0);
    }
    iVar1 = fseek((FILE *)*in_RDI,*in_RSI,0);
    if (iVar1 != 0) break;
    sVar2 = fwrite(in_RDX,(ulong)in_CX,1,(FILE *)*in_RDI);
    if (sVar2 == 1) {
      return;
    }
    mcscompact(in_stack_00000210);
    iVar3 = iVar3 + 1;
  }
  errsigf((errcxdef *)CONCAT26(in_CX,CONCAT24(in_stack_ffffffffffffffe4,iVar3)),
          in_stack_ffffffffffffffd8,0);
}

Assistant:

void mcswrt(mcscxdef *ctx, mcsdsdef *desc, uchar *buf, ushort bufl)
{
    int tries;
    
    desc->mcsdsosz = bufl;
    
    for (tries = 0 ; tries < 2 ; ++tries)
    {
        /* attempt to write the object to the swap file */
        if (osfseek(ctx->mcscxfp, desc->mcsdsptr, OSFSK_SET))
            errsig(ctx->mcscxerr, ERR_FSEEK);
        if (!osfwb(ctx->mcscxfp, buf, (size_t)bufl))
            return;
        
        /* couldn't write it; compact the swap file */
        mcscompact(ctx);
    }
    
    /* couldn't write to swap file, even after compacting it */
    errsig(ctx->mcscxerr, ERR_FWRITE);
}